

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraint_Loop.cc
# Opt level: O1

void __thiscall
RigidBodyDynamics::LoopConstraint::appendConstraintAxis
          (LoopConstraint *this,SpatialVector *constraintAxis,bool positionLevelConstraint,
          bool velocityLevelConstraint)

{
  uint *puVar1;
  iterator __position;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  this->dblA = 2.220446049250313e-15;
  __position._M_current = *(SpatialVector_t **)&this->field_0xe0;
  if (__position._M_current == *(SpatialVector_t **)&this->field_0xe8) {
    std::vector<SpatialVector_t,Eigen::aligned_allocator<SpatialVector_t>>::
    _M_realloc_insert<SpatialVector_t_const&>
              ((vector<SpatialVector_t,Eigen::aligned_allocator<SpatialVector_t>> *)
               &(this->super_Constraint).field_0xd8,__position,constraintAxis);
  }
  else {
    dVar2 = (constraintAxis->super_Matrix<double,_6,_1,_0,_6,_1>).
            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0];
    dVar3 = (constraintAxis->super_Matrix<double,_6,_1,_0,_6,_1>).
            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1];
    dVar4 = (constraintAxis->super_Matrix<double,_6,_1,_0,_6,_1>).
            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2];
    dVar5 = (constraintAxis->super_Matrix<double,_6,_1,_0,_6,_1>).
            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3];
    dVar6 = (constraintAxis->super_Matrix<double,_6,_1,_0,_6,_1>).
            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5];
    ((__position._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] =
         (constraintAxis->super_Matrix<double,_6,_1,_0,_6,_1>).
         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4];
    ((__position._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] = dVar6;
    ((__position._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] = dVar4;
    ((__position._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] = dVar5;
    ((__position._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] = dVar2;
    ((__position._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] = dVar3;
    *(long *)&this->field_0xe0 = *(long *)&this->field_0xe0 + 0x30;
  }
  std::vector<bool,_std::allocator<bool>_>::push_back
            (&(this->super_Constraint).positionConstraint,positionLevelConstraint);
  std::vector<bool,_std::allocator<bool>_>::push_back
            (&(this->super_Constraint).velocityConstraint,velocityLevelConstraint);
  puVar1 = &(this->super_Constraint).sizeOfConstraint;
  *puVar1 = *puVar1 + 1;
  return;
}

Assistant:

void LoopConstraint::
        appendConstraintAxis( const Math::SpatialVector &constraintAxis,
                              bool positionLevelConstraint,
                              bool velocityLevelConstraint)
{

  dblA = 10.0*std::numeric_limits<double>::epsilon();

  //Make sure the normal is valid
#ifndef RBDL_USE_CASADI_MATH
  assert( std::fabs(constraintAxis.norm()-1.) < dblA);
  for(unsigned int i=0; i<sizeOfConstraint;++i){
    assert(std::fabs(T[i].dot(constraintAxis)) <= dblA);
  }
#endif

  T.push_back(constraintAxis);
  positionConstraint.push_back(positionLevelConstraint);
  velocityConstraint.push_back(velocityLevelConstraint);
  sizeOfConstraint++;

  assert(sizeOfConstraint <= 6 && sizeOfConstraint > 0);
}